

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O0

Bool prvTidyisVoidElement(Node *node)

{
  TidyTagId TVar1;
  TidyTagId id;
  Node *node_local;
  
  if (node == (Node *)0x0) {
    node_local._4_4_ = no;
  }
  else if (node->tag == (Dict *)0x0) {
    node_local._4_4_ = no;
  }
  else {
    TVar1 = node->tag->id;
    if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_AREA)) {
      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_BASE))
      {
        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) || (node->tag->id != TidyTag_BR))
        {
          if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
             (node->tag->id != TidyTag_COL)) {
            if (TVar1 == TidyTag_COMMAND) {
              node_local._4_4_ = yes;
            }
            else if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                    (node->tag->id != TidyTag_EMBED)) {
              if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                 (node->tag->id != TidyTag_HR)) {
                if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                   (node->tag->id != TidyTag_IMG)) {
                  if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                     (node->tag->id != TidyTag_INPUT)) {
                    if (TVar1 == TidyTag_KEYGEN) {
                      node_local._4_4_ = yes;
                    }
                    else if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                            (node->tag->id != TidyTag_LINK)) {
                      if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                         (node->tag->id != TidyTag_META)) {
                        if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                           (node->tag->id != TidyTag_PARAM)) {
                          if (TVar1 == TidyTag_SOURCE) {
                            node_local._4_4_ = yes;
                          }
                          else if (TVar1 == TidyTag_TRACK) {
                            node_local._4_4_ = yes;
                          }
                          else if (((node == (Node *)0x0) || (node->tag == (Dict *)0x0)) ||
                                  (node->tag->id != TidyTag_WBR)) {
                            node_local._4_4_ = no;
                          }
                          else {
                            node_local._4_4_ = yes;
                          }
                        }
                        else {
                          node_local._4_4_ = yes;
                        }
                      }
                      else {
                        node_local._4_4_ = yes;
                      }
                    }
                    else {
                      node_local._4_4_ = yes;
                    }
                  }
                  else {
                    node_local._4_4_ = yes;
                  }
                }
                else {
                  node_local._4_4_ = yes;
                }
              }
              else {
                node_local._4_4_ = yes;
              }
            }
            else {
              node_local._4_4_ = yes;
            }
          }
          else {
            node_local._4_4_ = yes;
          }
        }
        else {
          node_local._4_4_ = yes;
        }
      }
      else {
        node_local._4_4_ = yes;
      }
    }
    else {
      node_local._4_4_ = yes;
    }
  }
  return node_local._4_4_;
}

Assistant:

static Bool TY_(isVoidElement)( Node *node )
{
    TidyTagId id;
    if ( !node )
        return no;
    if ( !node->tag )
        return no;
    id = node->tag->id;
    if (nodeIsAREA(node))
        return yes;
    if (nodeIsBASE(node))
        return yes;
    if (nodeIsBR(node))
        return yes;
    if (nodeIsCOL(node))
        return yes;
    /* if (nodeIsCOMMAND(node)) */
    if (id == TidyTag_COMMAND)
        return yes;
    if (nodeIsEMBED(node))
        return yes;
    if (nodeIsHR(node))
        return yes;
    if (nodeIsIMG(node))
        return yes;
    if (nodeIsINPUT(node))
        return yes;
    /* if (nodeIsKEYGEN(node)) */
    if (id == TidyTag_KEYGEN )
        return yes;
    if (nodeIsLINK(node))
        return yes;
    if (nodeIsMETA(node))
        return yes;
    if (nodeIsPARAM(node))
        return yes;
    /* if (nodeIsSOURCE(node)) */
    if (id == TidyTag_SOURCE )
        return yes;
    /* if (nodeIsTRACK(node)) */
    if (id == TidyTag_TRACK )
        return yes;
    if (nodeIsWBR(node))
        return yes;

    return no;
}